

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_parse_record_header(mbedtls_ssl_context *ssl)

{
  uchar *buf;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  int local_24;
  uint rec_epoch;
  int minor_ver;
  int major_ver;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  buf = ssl->in_hdr;
  _major_ver = ssl;
  sVar3 = mbedtls_ssl_hdr_len(ssl);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xd97,"input record header",buf,sVar3);
  uVar5 = (undefined4)(sVar3 >> 0x20);
  _major_ver->in_msgtype = (uint)*_major_ver->in_hdr;
  _major_ver->in_msglen = (long)(int)(uint)CONCAT11(*_major_ver->in_len,_major_ver->in_len[1]);
  mbedtls_ssl_read_version
            ((int *)&rec_epoch,&local_24,*(uint *)&_major_ver->conf->field_0x174 >> 1 & 1,
             _major_ver->in_hdr + 1);
  sVar3 = _major_ver->in_msglen;
  uVar4 = CONCAT44(uVar5,rec_epoch);
  iVar2 = local_24;
  mbedtls_debug_print_msg
            (_major_ver,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xda0,"input record: msgtype = %d, version = [%d:%d], msglen = %d",
             (ulong)(uint)_major_ver->in_msgtype,uVar4,local_24,sVar3);
  if ((((_major_ver->in_msgtype == 0x16) || (_major_ver->in_msgtype == 0x15)) ||
      (_major_ver->in_msgtype == 0x14)) || (_major_ver->in_msgtype == 0x17)) {
    if (rec_epoch == _major_ver->major_ver) {
      if ((int)(uint)_major_ver->conf->max_minor_ver < local_24) {
        mbedtls_debug_print_msg
                  (_major_ver,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xdbd,"minor version mismatch");
        ssl_local._4_4_ = -0x7200;
      }
      else if (0x414dU - ((long)_major_ver->in_msg - (long)_major_ver->in_buf) <
               _major_ver->in_msglen) {
        mbedtls_debug_print_msg
                  (_major_ver,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xdc5,"bad message length");
        ssl_local._4_4_ = -0x7200;
      }
      else {
        if (_major_ver->transform_in == (mbedtls_ssl_transform *)0x0) {
          if ((_major_ver->in_msglen == 0) || (0x4000 < _major_ver->in_msglen)) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xdcf,"bad message length");
            return -0x7200;
          }
        }
        else {
          if (_major_ver->in_msglen < _major_ver->transform_in->minlen) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xdd7,"bad message length");
            return -0x7200;
          }
          if ((0 < _major_ver->minor_ver) &&
             (_major_ver->transform_in->minlen + 0x4100 < _major_ver->in_msglen)) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xdec,"bad message length");
            return -0x7200;
          }
        }
        if ((*(uint *)&_major_ver->conf->field_0x174 >> 1 & 1) == 1) {
          uVar1 = (uint)CONCAT11(*_major_ver->in_ctr,_major_ver->in_ctr[1]);
          if (((_major_ver->in_msgtype == 0x14) && (_major_ver->state != 10)) &&
             (_major_ver->state != 0xc)) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xe02,"dropping unexpected ChangeCipherSpec");
            return -0x6700;
          }
          if (((_major_ver->in_msgtype == 0x17) && (_major_ver->state != 0x10)) &&
             ((_major_ver->renego_status != 1 || (_major_ver->state != 2)))) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xe10,"dropping unexpected ApplicationData");
            return -0x6700;
          }
          if (uVar1 != _major_ver->in_epoch) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xe19,"record from another epoch: expected %d, received %d",
                       (ulong)_major_ver->in_epoch,CONCAT44((int)((ulong)uVar4 >> 0x20),uVar1),iVar2
                       ,sVar3);
            if ((((*(uint *)&_major_ver->conf->field_0x174 & 1) == 1) && (_major_ver->state == 0x10)
                ) && ((uVar1 == 0 &&
                      (((_major_ver->in_msgtype == 0x16 && (0xd < _major_ver->in_left)) &&
                       (_major_ver->in_buf[0xd] == '\x01')))))) {
              mbedtls_debug_print_msg
                        (_major_ver,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0xe2a,"possible client reconnect from the same port");
              iVar2 = ssl_handle_possible_reconnect(_major_ver);
              return iVar2;
            }
            return -0x6700;
          }
          if ((uVar1 == _major_ver->in_epoch) &&
             (iVar2 = mbedtls_ssl_dtls_replay_check(_major_ver), iVar2 != 0)) {
            mbedtls_debug_print_msg
                      (_major_ver,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0xe37,"replayed record");
            return -0x6700;
          }
        }
        ssl_local._4_4_ = 0;
      }
    }
    else {
      mbedtls_debug_print_msg
                (_major_ver,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xdb7,"major version mismatch");
      ssl_local._4_4_ = -0x7200;
    }
  }
  else {
    mbedtls_debug_print_msg
              (_major_ver,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xda8,"unknown record type");
    ssl_local._4_4_ = mbedtls_ssl_send_alert_message(_major_ver,'\x02','\n');
    if (ssl_local._4_4_ == 0) {
      ssl_local._4_4_ = -0x7200;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_record_header( mbedtls_ssl_context *ssl )
{
    int ret;
    int major_ver, minor_ver;

    MBEDTLS_SSL_DEBUG_BUF( 4, "input record header", ssl->in_hdr, mbedtls_ssl_hdr_len( ssl ) );

    ssl->in_msgtype =  ssl->in_hdr[0];
    ssl->in_msglen = ( ssl->in_len[0] << 8 ) | ssl->in_len[1];
    mbedtls_ssl_read_version( &major_ver, &minor_ver, ssl->conf->transport, ssl->in_hdr + 1 );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "input record: msgtype = %d, "
                        "version = [%d:%d], msglen = %d",
                        ssl->in_msgtype,
                        major_ver, minor_ver, ssl->in_msglen ) );

    /* Check record type */
    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msgtype != MBEDTLS_SSL_MSG_ALERT &&
        ssl->in_msgtype != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC &&
        ssl->in_msgtype != MBEDTLS_SSL_MSG_APPLICATION_DATA )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "unknown record type" ) );

        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                        MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE ) ) != 0 )
        {
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    /* Check version */
    if( major_ver != ssl->major_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "major version mismatch" ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    if( minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "minor version mismatch" ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    /* Check length against the size of our buffer */
    if( ssl->in_msglen > MBEDTLS_SSL_BUFFER_LEN
                         - (size_t)( ssl->in_msg - ssl->in_buf ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad message length" ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    /* Check length against bounds of the current transform and version */
    if( ssl->transform_in == NULL )
    {
        if( ssl->in_msglen < 1 ||
            ssl->in_msglen > MBEDTLS_SSL_MAX_CONTENT_LEN )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad message length" ) );
            return( MBEDTLS_ERR_SSL_INVALID_RECORD );
        }
    }
    else
    {
        if( ssl->in_msglen < ssl->transform_in->minlen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad message length" ) );
            return( MBEDTLS_ERR_SSL_INVALID_RECORD );
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 &&
            ssl->in_msglen > ssl->transform_in->minlen + MBEDTLS_SSL_MAX_CONTENT_LEN )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad message length" ) );
            return( MBEDTLS_ERR_SSL_INVALID_RECORD );
        }
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        /*
         * TLS encrypted messages can have up to 256 bytes of padding
         */
        if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 &&
            ssl->in_msglen > ssl->transform_in->minlen +
                             MBEDTLS_SSL_MAX_CONTENT_LEN + 256 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad message length" ) );
            return( MBEDTLS_ERR_SSL_INVALID_RECORD );
        }
#endif
    }

    /*
     * DTLS-related tests done last, because most of them may result in
     * silently dropping the record (but not the whole datagram), and we only
     * want to consider that after ensuring that the "basic" fields (type,
     * version, length) are sane.
     */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        unsigned int rec_epoch = ( ssl->in_ctr[0] << 8 ) | ssl->in_ctr[1];

        /* Drop unexpected ChangeCipherSpec messages */
        if( ssl->in_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC &&
            ssl->state != MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC &&
            ssl->state != MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "dropping unexpected ChangeCipherSpec" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_RECORD );
        }

        /* Drop unexpected ApplicationData records,
         * except at the beginning of renegotiations */
        if( ssl->in_msgtype == MBEDTLS_SSL_MSG_APPLICATION_DATA &&
            ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER
#if defined(MBEDTLS_SSL_RENEGOTIATION)
            && ! ( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS &&
                   ssl->state == MBEDTLS_SSL_SERVER_HELLO )
#endif
            )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "dropping unexpected ApplicationData" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_RECORD );
        }

        /* Check epoch (and sequence number) with DTLS */
        if( rec_epoch != ssl->in_epoch )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "record from another epoch: "
                                        "expected %d, received %d",
                                        ssl->in_epoch, rec_epoch ) );

#if defined(MBEDTLS_SSL_DTLS_CLIENT_PORT_REUSE) && defined(MBEDTLS_SSL_SRV_C)
            /*
             * Check for an epoch 0 ClientHello. We can't use in_msg here to
             * access the first byte of record content (handshake type), as we
             * have an active transform (possibly iv_len != 0), so use the
             * fact that the record header len is 13 instead.
             */
            if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
                ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER &&
                rec_epoch == 0 &&
                ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
                ssl->in_left > 13 &&
                ssl->in_buf[13] == MBEDTLS_SSL_HS_CLIENT_HELLO )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "possible client reconnect "
                                            "from the same port" ) );
                return( ssl_handle_possible_reconnect( ssl ) );
            }
            else
#endif /* MBEDTLS_SSL_DTLS_CLIENT_PORT_REUSE && MBEDTLS_SSL_SRV_C */
                return( MBEDTLS_ERR_SSL_UNEXPECTED_RECORD );
        }

#if defined(MBEDTLS_SSL_DTLS_ANTI_REPLAY)
        /* Replay detection only works for the current epoch */
        if( rec_epoch == ssl->in_epoch &&
            mbedtls_ssl_dtls_replay_check( ssl ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "replayed record" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_RECORD );
        }
#endif
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    return( 0 );
}